

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

HydroProp * __thiscall OpenMD::Sphere::getHydroProp(Sphere *this,RealType viscosity)

{
  Mat6x6d *pMVar1;
  Mat6x6d *pMVar2;
  double *pdVar3;
  Vector3d *cor;
  HydroProp *pHVar4;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  HydroProp *hprop;
  Mat6x6d Xi;
  RealType Xirr;
  RealType Xitt;
  Shape *in_stack_fffffffffffffcb8;
  RectMatrix<double,_6U,_6U> *in_stack_fffffffffffffcc0;
  Mat6x6d *Xi_00;
  HydroProp *pHVar6;
  string local_2b8 [39];
  undefined1 local_291;
  HydroProp *local_158;
  RectMatrix<double,_6U,_6U> local_140;
  Mat6x6d *local_20;
  HydroProp *local_18;
  
  local_18 = (HydroProp *)(in_XMM0_Qa * 18.84955592153876 * *(double *)(in_RDI + 0x40));
  dVar5 = pow(*(double *)(in_RDI + 0x40),3.0);
  local_20 = (Mat6x6d *)(in_XMM0_Qa * 25.132741228718345 * dVar5);
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)in_stack_fffffffffffffcc0);
  pHVar6 = local_18;
  pdVar3 = RectMatrix<double,_6U,_6U>::operator()(&local_140,0,0);
  pHVar4 = local_18;
  *pdVar3 = (double)pHVar6;
  pdVar3 = RectMatrix<double,_6U,_6U>::operator()(&local_140,1,1);
  *pdVar3 = (double)pHVar4;
  pHVar6 = local_18;
  pdVar3 = RectMatrix<double,_6U,_6U>::operator()(&local_140,2,2);
  *pdVar3 = (double)pHVar6;
  Xi_00 = local_20;
  cor = (Vector3d *)RectMatrix<double,_6U,_6U>::operator()(&local_140,3,3);
  pMVar1 = local_20;
  (cor->super_Vector<double,_3U>).data_[0] = (double)Xi_00;
  pdVar3 = RectMatrix<double,_6U,_6U>::operator()(&local_140,4,4);
  pMVar2 = local_20;
  *pdVar3 = (double)pMVar1;
  pdVar3 = RectMatrix<double,_6U,_6U>::operator()(&local_140,5,5);
  *pdVar3 = (double)pMVar2;
  RectMatrix<double,_6U,_6U>::operator*=
            (in_stack_fffffffffffffcc0,(double)in_stack_fffffffffffffcb8);
  pHVar4 = (HydroProp *)operator_new(0x280);
  local_291 = 1;
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffcc0,
             (Vector3<double> *)in_stack_fffffffffffffcb8);
  SquareMatrix<double,_6>::SquareMatrix
            ((SquareMatrix<double,_6> *)in_stack_fffffffffffffcc0,
             (SquareMatrix<double,_6> *)in_stack_fffffffffffffcb8);
  HydroProp::HydroProp(pHVar6,cor,Xi_00);
  local_291 = 0;
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3e74db);
  local_158 = pHVar4;
  Shape::getName_abi_cxx11_(in_stack_fffffffffffffcb8);
  HydroProp::setName(pHVar4,(string *)in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_2b8);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3e7543);
  return local_158;
}

Assistant:

HydroProp* Sphere::getHydroProp(RealType viscosity) {
    RealType Xitt = 6.0 * Constants::PI * viscosity * radius_;
    RealType Xirr = 8.0 * Constants::PI * viscosity * pow(radius_, 3);

    Mat6x6d Xi;

    Xi(0, 0) = Xitt;
    Xi(1, 1) = Xitt;
    Xi(2, 2) = Xitt;
    Xi(3, 3) = Xirr;
    Xi(4, 4) = Xirr;
    Xi(5, 5) = Xirr;

    Xi *= Constants::viscoConvert;

    HydroProp* hprop = new HydroProp(V3Zero, Xi);
    hprop->setName(getName());
    return hprop;
  }